

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::ZLIBBufferCompressorTest_compressor_and_decompressor_can_be_reused_Test::
TestBody(ZLIBBufferCompressorTest_compressor_and_decompressor_can_be_reused_Test *this)

{
  __uniq_ptr_data<const_char,_std::default_delete<const_char>,_true,_true> _Var1;
  long lVar2;
  char *pcVar3;
  AssertHelper AStack_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  unique_ptr<const_char,_std::default_delete<const_char>_> decompressed_bytes2;
  unique_ptr<const_char,_std::default_delete<const_char>_> decompressed_bytes1;
  AssertionResult gtest_ar_1;
  ByteBuffer compressed2;
  char local_1e0 [32];
  ByteBuffer decompressed2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8 [5];
  ByteBuffer decompressed1;
  ByteBuffer compressed1;
  ZLIBBufferInflator decompressor1;
  ZLIBBufferCompressor compressor1;
  
  bidfx_public_api::tools::ZLIBBufferCompressor::ZLIBBufferCompressor(&compressor1,5);
  bidfx_public_api::tools::ZLIBBufferCompressor::Compress
            ((uchar *)&compressor1,
             (ulong)(this->super_ZLIBBufferCompressorTest).FRACTION_OF_BIGGER_TEXT._M_dataplus._M_p,
             0);
  bidfx_public_api::tools::ZLIBBufferCompressor::GetCompressed();
  bidfx_public_api::tools::ZLIBBufferInflator::ZLIBBufferInflator(&decompressor1);
  bidfx_public_api::tools::ZLIBBufferInflator::Inflate(&decompressed1);
  _Var1.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
  super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
  super__Head_base<0UL,_const_char_*,_false>._M_head_impl =
       (__uniq_ptr_impl<const_char,_std::default_delete<const_char>_>)
       bidfx_public_api::tools::ByteBuffer::ToArray();
  decompressed_bytes1._M_t.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
  super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
  super__Head_base<0UL,_const_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_char,_std::default_delete<const_char>,_true,_true>)
       (__uniq_ptr_data<const_char,_std::default_delete<const_char>,_true,_true>)
       _Var1.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
       super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
       super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  lVar2 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
  _compressed2 = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&compressed2,
             _Var1.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
             super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
             super__Head_base<0UL,_const_char_*,_false>._M_head_impl,
             (long)_Var1.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
                   super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
                   super__Head_base<0UL,_const_char_*,_false>._M_head_impl + lVar2);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&decompressed2,"FRACTION_OF_BIGGER_TEXT",
             "std::string(decompressed_bytes1.get(), decompressed1.ReadableBytes())",
             &(this->super_ZLIBBufferCompressorTest).FRACTION_OF_BIGGER_TEXT,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&compressed2);
  std::__cxx11::string::~string((string *)&compressed2);
  if (decompressed2 == (ByteBuffer)0x0) {
    testing::Message::Message((Message *)&compressed2);
    if (local_1b8[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_1b8[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_230,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/zlib_buffer_compressor_test.cpp"
               ,0x113,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_230,(Message *)&compressed2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_230);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&compressed2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(local_1b8);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(local_1b8);
    bidfx_public_api::tools::ZLIBBufferCompressor::Compress
              ((uchar *)&compressor1,
               (ulong)(this->super_ZLIBBufferCompressorTest).BIGGER_TEXT._M_dataplus._M_p,0);
    bidfx_public_api::tools::ZLIBBufferCompressor::GetCompressed();
    bidfx_public_api::tools::ZLIBBufferInflator::Inflate(&decompressed2);
    _Var1.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
    super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
    super__Head_base<0UL,_const_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<const_char,_std::default_delete<const_char>_>)
         bidfx_public_api::tools::ByteBuffer::ToArray();
    decompressed_bytes2._M_t.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>.
    _M_t.super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
    super__Head_base<0UL,_const_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<const_char,_std::default_delete<const_char>,_true,_true>)
         (__uniq_ptr_data<const_char,_std::default_delete<const_char>,_true,_true>)
         _Var1.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
         super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
         super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
    lVar2 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,
               _Var1.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
               super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
               super__Head_base<0UL,_const_char_*,_false>._M_head_impl,
               (long)_Var1.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
                     super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
                     super__Head_base<0UL,_const_char_*,_false>._M_head_impl + lVar2);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar_1,"BIGGER_TEXT",
               "std::string(decompressed_bytes2.get(), decompressed2.ReadableBytes())",
               &(this->super_ZLIBBufferCompressorTest).BIGGER_TEXT,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_230);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_238,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/zlib_buffer_compressor_test.cpp"
                 ,0x11a,pcVar3);
      testing::internal::AssertHelper::operator=(&AStack_238,(Message *)&local_230);
      testing::internal::AssertHelper::~AssertHelper(&AStack_238);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_230);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    std::unique_ptr<const_char,_std::default_delete<const_char>_>::~unique_ptr(&decompressed_bytes2)
    ;
    bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&decompressed2);
    bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&compressed2);
  }
  std::unique_ptr<const_char,_std::default_delete<const_char>_>::~unique_ptr(&decompressed_bytes1);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&decompressed1);
  bidfx_public_api::tools::ZLIBBufferInflator::~ZLIBBufferInflator(&decompressor1);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&compressed1);
  bidfx_public_api::tools::ZLIBBufferCompressor::~ZLIBBufferCompressor(&compressor1);
  return;
}

Assistant:

TEST_F(ZLIBBufferCompressorTest, compressor_and_decompressor_can_be_reused)
{
    ZLIBBufferCompressor compressor1 = ZLIBBufferCompressor(5);
    compressor1.Compress((unsigned char*) &FRACTION_OF_BIGGER_TEXT[0], 0, FRACTION_OF_BIGGER_TEXT.size());
    ByteBuffer compressed1 = compressor1.GetCompressed();

    ZLIBBufferInflator decompressor1;
    ByteBuffer decompressed1 = decompressor1.Inflate(compressed1);
    std::unique_ptr<const char> decompressed_bytes1 = std::unique_ptr<const char>((const char*) decompressed1.ToArray());
    ASSERT_EQ(FRACTION_OF_BIGGER_TEXT, std::string(decompressed_bytes1.get(), decompressed1.ReadableBytes()));

    compressor1.Compress((unsigned char*) &BIGGER_TEXT[0], 0, BIGGER_TEXT.size());
    ByteBuffer compressed2 = compressor1.GetCompressed();

    ByteBuffer decompressed2 = decompressor1.Inflate(compressed2);
    std::unique_ptr<const char> decompressed_bytes2 = std::unique_ptr<const char>((const char*) decompressed2.ToArray());
    EXPECT_EQ(BIGGER_TEXT, std::string(decompressed_bytes2.get(), decompressed2.ReadableBytes()));
}